

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueFederateManager.cpp
# Opt level: O1

void __thiscall
helics::ValueFederateManager::getUpdateFromCore
          (ValueFederateManager *this,InterfaceHandle updatedHandle)

{
  long lVar1;
  void *pvVar2;
  undefined8 uVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  int iVar4;
  undefined4 extraout_var;
  Input **ppIVar5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  undefined4 in_register_00000034;
  SmallBuffer *__tmp;
  handle inpHandle;
  BlockIterator<helics::Input,_32,_helics::Input_**> fid;
  InterfaceHandle local_54;
  handle local_50;
  BlockIterator<helics::Input,_32,_helics::Input_**> local_38;
  
  local_54.hid = updatedHandle.hid;
  iVar4 = (*this->coreObject->_vptr_Core[0x32])
                    (this->coreObject,CONCAT44(in_register_00000034,updatedHandle.hid),0);
  lVar1 = *(long *)CONCAT44(extraout_var,iVar4);
  this_01 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
            ((long *)CONCAT44(extraout_var,iVar4))[1];
  if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_01->_M_use_count = this_01->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this_01->_M_use_count = this_01->_M_use_count + 1;
    }
  }
  gmlc::libguarded::
  shared_guarded_opt<gmlc::containers::DualStringMappedVector<helics::Input,_helics::InterfaceHandle,_(reference_stability)0,_5>,_std::mutex>
  ::lock(&local_50,&this->inputs);
  gmlc::containers::
  DualStringMappedVector<helics::Input,_helics::InterfaceHandle,_(reference_stability)0,_5>::find
            (&local_38,local_50.data,&local_54);
  iVar4 = ((local_50.data)->dataStorage).bsize;
  ppIVar5 = ((local_50.data)->dataStorage).dataptr;
  if (iVar4 == 0x20) {
    if (ppIVar5 == (Input **)0x0) {
      ppIVar5 = &gmlc::containers::
                 StableBlockVector<helics::Input,_5U,_std::allocator<helics::Input>_>::end::
                 emptyValue;
    }
    else {
      ppIVar5 = ppIVar5 + (long)((local_50.data)->dataStorage).dataSlotIndex + 1;
    }
    iVar4 = 0;
  }
  else {
    ppIVar5 = ppIVar5 + ((local_50.data)->dataStorage).dataSlotIndex;
  }
  if (((ppIVar5 != local_38.vec) &&
      ((((local_38.vec == (Input **)0x0 || (ppIVar5 == (Input **)0x0)) ||
        (*local_38.vec != (Input *)0x0)) || (*ppIVar5 != (Input *)0x0)))) ||
     (iVar4 != local_38.offset)) {
    pvVar2 = (local_38.ptr)->dataReference;
    uVar3 = *(undefined8 *)(lVar1 + 0x50);
    *(undefined8 *)((long)pvVar2 + 8) = *(undefined8 *)(lVar1 + 0x40);
    *(undefined8 *)((long)pvVar2 + 0x10) = uVar3;
    *(long *)((long)pvVar2 + 0x18) = lVar1;
    this_00 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)pvVar2 + 0x20);
    *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)pvVar2 + 0x20) = this_01;
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    }
    *(baseType *)((long)pvVar2 + 0x28) = (this->CurrentTime).internalTimeCode;
    this_01 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  }
  std::unique_lock<std::mutex>::~unique_lock(&local_50.m_handle_lock);
  if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
  }
  return;
}

Assistant:

void ValueFederateManager::getUpdateFromCore(InterfaceHandle updatedHandle)
{
    auto data = coreObject->getValue(updatedHandle);
    auto inpHandle = inputs.lock();
    /** find the id*/
    auto fid = inpHandle->find(updatedHandle);
    if (fid != inpHandle->end()) {  // assign the data

        auto* info = static_cast<InputData*>(fid->dataReference);
        info->lastData = data_view(std::move(data));
        info->lastUpdate = CurrentTime;
    }
}